

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void offset_append_with_merge(roaring_array_t *ra,int k,container_t *c,uint8_t t)

{
  uint16_t uVar1;
  int32_t iVar2;
  container_t *c_00;
  container_t *c_01;
  undefined1 in_CL;
  container_t *in_RDX;
  uint in_ESI;
  roaring_array_t *in_RDI;
  container_t *new_c;
  container_t *last_c;
  uint8_t new_t;
  uint8_t last_t;
  int size;
  undefined8 in_stack_ffffffffffffffc8;
  uint8_t type;
  container_t *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  uint8_t in_stack_ffffffffffffffde;
  uint8_t in_stack_ffffffffffffffdf;
  undefined3 in_stack_ffffffffffffffe4;
  undefined4 uVar3;
  
  uVar3 = CONCAT13(in_CL,in_stack_ffffffffffffffe4);
  iVar2 = ra_get_size(in_RDI);
  if ((iVar2 != 0) && (uVar1 = ra_get_key_at_index(in_RDI,(short)iVar2 - 1), uVar1 == in_ESI)) {
    c_00 = ra_get_container_at_index(in_RDI,(short)iVar2 - 1,&stack0xffffffffffffffdf);
    c_01 = container_ior(in_RDI,(uint8_t)(in_ESI >> 0x18),in_RDX,(uint8_t)((uint)uVar3 >> 0x18),
                         (uint8_t *)
                         CONCAT17(in_stack_ffffffffffffffdf,
                                  CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)));
    ra_set_container_at_index(in_RDI,iVar2 + -1,c_01,in_stack_ffffffffffffffde);
    type = (uint8_t)((ulong)c_01 >> 0x38);
    if (c_00 != c_01) {
      container_free(c_00,type);
    }
    container_free(c_00,type);
    return;
  }
  ra_append((roaring_array_t *)CONCAT44(uVar3,iVar2),
            CONCAT11(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde),in_stack_ffffffffffffffd0,
            (uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
  return;
}

Assistant:

static void offset_append_with_merge(roaring_array_t *ra, int k, container_t *c,
                                     uint8_t t) {
    int size = ra_get_size(ra);
    if (size == 0 || ra_get_key_at_index(ra, (uint16_t)(size - 1)) != k) {
        // No merge.
        ra_append(ra, (uint16_t)k, c, t);
        return;
    }

    uint8_t last_t, new_t;
    container_t *last_c, *new_c;

    // NOTE: we don't need to unwrap here, since we added last_c ourselves
    // we have the certainty it's not a shared container.
    // The same applies to c, as it's the result of calling container_offset.
    last_c = ra_get_container_at_index(ra, (uint16_t)(size - 1), &last_t);
    new_c = container_ior(last_c, last_t, c, t, &new_t);

    ra_set_container_at_index(ra, size - 1, new_c, new_t);

    // Comparison of pointers of different origin is UB (or so claim some
    // compiler makers), so we compare their bit representation only.
    if ((uintptr_t)last_c != (uintptr_t)new_c) {
        container_free(last_c, last_t);
    }
    container_free(c, t);
}